

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O1

void fatal_input_error(char *fmt,...)

{
  char in_AL;
  InputFile *pIVar1;
  InputFile *pIVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int levels_back;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_f8;
  void **local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_d0 = in_RSI;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  pIVar1 = get_input_file(0);
  pIVar2 = get_input_file(1);
  if (pIVar2 != (InputFile *)0x0) {
    error("In file included from %s:%d",pIVar2->filename,pIVar2->lineno);
    pIVar2 = get_input_file(2);
    if (pIVar2 != (InputFile *)0x0) {
      levels_back = 3;
      do {
        error(", from %s:%d",pIVar2->filename,pIVar2->lineno);
        pIVar2 = get_input_file(levels_back);
        levels_back = levels_back + 1;
      } while (pIVar2 != (InputFile *)0x0);
    }
    error(":\n");
  }
  if (pIVar1 != (InputFile *)0x0) {
    error("%s: %d: ",pIVar1->filename,pIVar1->lineno);
  }
  local_e8 = local_d8;
  local_f0 = &ap[0].overflow_arg_area;
  local_f8 = 0x3000000008;
  vfprintf(_stderr,fmt,&local_f8);
  fputs("*** Exit\n",_stderr);
  exit(-1);
}

Assistant:

void
fatal_input_error (const char *fmt, ...)
{
  va_list ap;
  const InputFile *current = get_input_file (0);
  const InputFile *tmp = get_input_file (1);
  int lev = 2;

  if (tmp != NULL)
    {
      error ("In file included from %s:%d", tmp->filename, tmp->lineno);
      for (tmp = get_input_file (2); tmp != NULL; tmp = get_input_file (++lev))
	error (", from %s:%d", tmp->filename, tmp->lineno);
      error (":\n");
    }
  if (current != NULL)
    error ("%s: %d: ", current->filename, current->lineno);

  va_start (ap, fmt);
  vfprintf (stderr, fmt, ap);
  fputs ("*** Exit\n", stderr);
  exit (-1);
}